

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::MemberInitSeparator::operator()
          (MemberInitSeparator *this)

{
  size_t *psVar1;
  
  if (this->separators_ == true) {
    io::Printer::Emit(this->printer_,2,",\n");
    return;
  }
  io::Printer::Emit(this->printer_,2,": ");
  psVar1 = &this->printer_->indent_;
  *psVar1 = *psVar1 + (this->printer_->options_).spaces_per_indent;
  this->separators_ = true;
  return;
}

Assistant:

void operator()() {
    if (separators_) {
      printer_->Emit(",\n");
    } else {
      printer_->Emit(": ");
      printer_->Indent();
      separators_ = true;
    }
  }